

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O1

int Curl_parsenetrc(char *host,char **loginp,char **passwordp,char *netrcfile)

{
  int iVar1;
  __uid_t __uid;
  passwd *ppVar2;
  char *netrcfile_00;
  passwd *ppVar3;
  passwd *pw_res;
  passwd pw;
  char pwbuf [1024];
  passwd *local_470;
  passwd local_468;
  char local_438 [1032];
  
  if (netrcfile != (char *)0x0) {
    iVar1 = parsenetrc(host,loginp,passwordp,netrcfile);
    return iVar1;
  }
  ppVar2 = (passwd *)curl_getenv("HOME");
  ppVar3 = ppVar2;
  if (ppVar2 == (passwd *)0x0) {
    __uid = geteuid();
    iVar1 = getpwuid_r(__uid,&local_468,local_438,0x400,&local_470);
    if (local_470 != (passwd *)0x0) {
      local_470 = (passwd *)local_468.pw_dir;
    }
    ppVar3 = (passwd *)0x0;
    if (iVar1 == 0) {
      ppVar3 = local_470;
    }
  }
  if (ppVar3 == (passwd *)0x0) {
    iVar1 = 1;
  }
  else {
    netrcfile_00 = curl_maprintf("%s%s.netrc",ppVar3,"/");
    if (netrcfile_00 == (char *)0x0) {
      iVar1 = -1;
    }
    else {
      iVar1 = parsenetrc(host,loginp,passwordp,netrcfile_00);
      (*Curl_cfree)(netrcfile_00);
    }
    (*Curl_cfree)(ppVar2);
  }
  return iVar1;
}

Assistant:

int Curl_parsenetrc(const char *host, char **loginp, char **passwordp,
                    char *netrcfile)
{
  int retcode = 1;
  char *filealloc = NULL;

  if(!netrcfile) {
#if defined(HAVE_GETPWUID_R) && defined(HAVE_GETEUID)
    char pwbuf[1024];
#endif
    char *home = NULL;
    char *homea = curl_getenv("HOME"); /* portable environment reader */
    if(homea) {
      home = homea;
#if defined(HAVE_GETPWUID_R) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd pw, *pw_res;
      if(!getpwuid_r(geteuid(), &pw, pwbuf, sizeof(pwbuf), &pw_res)
         && pw_res) {
        home = pw.pw_dir;
      }
#elif defined(HAVE_GETPWUID) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd *pw;
      pw = getpwuid(geteuid());
      if(pw) {
        home = pw->pw_dir;
      }
#elif defined(_WIN32)
    }
    else {
      homea = curl_getenv("USERPROFILE");
      if(homea) {
        home = homea;
      }
#endif
    }

    if(!home)
      return retcode; /* no home directory found (or possibly out of
                         memory) */

    filealloc = curl_maprintf("%s%s.netrc", home, DIR_CHAR);
    if(!filealloc) {
      free(homea);
      return -1;
    }
    retcode = parsenetrc(host, loginp, passwordp, filealloc);
    free(filealloc);
#ifdef _WIN32
    if(retcode == NETRC_FILE_MISSING) {
      /* fallback to the old-style "_netrc" file */
      filealloc = curl_maprintf("%s%s_netrc", home, DIR_CHAR);
      if(!filealloc) {
        free(homea);
        return -1;
      }
      retcode = parsenetrc(host, loginp, passwordp, filealloc);
      free(filealloc);
    }
#endif
    free(homea);
  }